

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::InitializeElementMatrix
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZElementMatrix *ef)

{
  int iVar1;
  int iVar2;
  TPZCompMesh *pTVar3;
  undefined4 extraout_var;
  int64_t iVar4;
  TPZCompElSide *this_00;
  long *plVar5;
  undefined4 extraout_var_00;
  long lVar6;
  long *in_RSI;
  TPZBlock *in_RDI;
  uint ndof;
  int i;
  int numstate;
  TPZMaterial *mat;
  TPZInterpolationSpace *msp;
  int64_t iref;
  int numloadcases;
  int nstate;
  int64_t nref;
  int64_t neqThisConn;
  int ic;
  int numeq;
  int ncon;
  TPZCompEl *in_stack_00000130;
  TPZCompMesh *in_stack_ffffffffffffff50;
  TPZConnect *in_stack_ffffffffffffff58;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffff60;
  TPZCompEl *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  TPZManVector<long,_10> *in_stack_ffffffffffffff80;
  uint local_60;
  int64_t local_48;
  uint local_1c;
  int local_18;
  undefined4 extraout_var_01;
  
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x12])();
  pTVar3 = TPZCompEl::Mesh(in_stack_00000130);
  in_RSI[2] = (long)pTVar3;
  *(undefined4 *)(in_RSI + 1) = 1;
  local_18 = 0;
  for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)local_1c);
    in_stack_ffffffffffffff70 = CONCAT44(extraout_var,iVar2);
    TPZCompEl::Mesh(in_stack_00000130);
    iVar2 = TPZConnect::NDof(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_18 = local_18 + iVar2;
  }
  iVar4 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)((in_RDI->fBlock).fExtAlloc + 5));
  iVar2 = InitializeElementMatrix::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff58);
  for (local_48 = 0; local_48 < iVar4; local_48 = local_48 + 1) {
    this_00 = TPZVec<TPZCompElSide>::operator[]
                        ((TPZVec<TPZCompElSide> *)((in_RDI->fBlock).fExtAlloc + 5),local_48);
    in_stack_ffffffffffffff68 = TPZCompElSide::Element(this_00);
    if (in_stack_ffffffffffffff68 == (TPZCompEl *)0x0) {
      in_stack_ffffffffffffff60 =
           (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x0;
    }
    else {
      in_stack_ffffffffffffff60 =
           (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
           __dynamic_cast(in_stack_ffffffffffffff68,&TPZCompEl::typeinfo,
                          &TPZInterpolationSpace::typeinfo,0);
    }
    if (in_stack_ffffffffffffff60 !=
        (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x0) {
      plVar5 = (long *)(*(code *)(in_stack_ffffffffffffff60->
                                 super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>
                                 )._M_impl._M_node.super__List_node_base._M_next[0xb]._M_prev)();
      (**(code **)(*plVar5 + 0x78))();
    }
  }
  plVar5 = (long *)(**(code **)(*in_RSI + 0x40))();
  (**(code **)(*plVar5 + 0x70))(plVar5,(long)local_18,(long)iVar2);
  (**(code **)(*in_RSI + 0x50))();
  TPZBlock::SetNBlocks(in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  for (local_60 = 0; (int)local_60 < iVar1; local_60 = local_60 + 1) {
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)local_60);
    in_stack_ffffffffffffff58 = (TPZConnect *)CONCAT44(extraout_var_00,iVar2);
    TPZCompEl::Mesh(in_stack_00000130);
    TPZConnect::NDof(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    (**(code **)(*in_RSI + 0x50))();
    TPZBlock::Set(in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                  (int)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  TPZManVector<long,_10>::Resize(in_stack_ffffffffffffff80,(int64_t)in_RDI);
  for (local_60 = 0; (int)local_60 < iVar1; local_60 = local_60 + 1) {
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,(ulong)local_60);
    lVar6 = CONCAT44(extraout_var_01,iVar2);
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RSI + 3),(long)(int)local_60);
    *plVar5 = lVar6;
  }
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x34])(&stack0xffffffffffffff80);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::operator=
            (in_stack_ffffffffffffff60,
             (list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
             in_stack_ffffffffffffff58);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b5c3f6);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ef)
{
    const int ncon = this->NConnects();
    ef.fMesh = Mesh();
    ef.fType = TPZElementMatrix::EF;
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ef.Matrix().Redim(numeq,numloadcases);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ef.Block().Set(i,ndof);
    }
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ef.fOneRestraints = GetShapeRestraints();
}